

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O2

void __thiscall SimpleLoggerMgr::logStackBackTraceOtherThreads(SimpleLoggerMgr *this)

{
  _Hash_node_base __threadid;
  char cVar1;
  ostream *poVar2;
  pthread_t pVar3;
  pthread_t tid;
  __node_base *p_Var4;
  bool bVar5;
  string msg_1;
  string msg;
  sigset_t _mask;
  
  if (this->crashDumpOriginOnly == false) {
    pVar3 = pthread_self();
    LOCK();
    bVar5 = (this->crashOriginThread).super___atomic_base<unsigned_long>._M_i == 0;
    if (bVar5) {
      (this->crashOriginThread).super___atomic_base<unsigned_long>._M_i = pVar3;
    }
    UNLOCK();
    if (bVar5) {
      std::mutex::lock(&this->activeThreadsLock);
      std::__cxx11::string::string((string *)&msg_1,"captured ",(allocator *)&msg);
      std::__cxx11::to_string((string *)&_mask,(this->activeThreads)._M_h._M_element_count);
      std::operator+(&msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &_mask," active threads");
      std::__cxx11::string::append((string *)&msg_1);
      std::__cxx11::string::~string((string *)&msg);
      std::__cxx11::string::~string((string *)&_mask);
      flushAllLoggers(this,2,&msg_1);
      cVar1 = std::__basic_file<char>::is_open();
      if (cVar1 != '\0') {
        poVar2 = std::operator<<((ostream *)&this->crashDumpFile,(string *)&msg_1);
        std::operator<<(poVar2,"\n\n");
      }
      p_Var4 = &(this->activeThreads)._M_h._M_before_begin;
      while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
        __threadid._M_nxt = p_Var4[1]._M_nxt;
        if (__threadid._M_nxt !=
            (_Hash_node_base *)(this->crashOriginThread).super___atomic_base<unsigned_long>._M_i) {
          sigfillset((sigset_t *)&msg._M_string_length);
          msg._M_dataplus._M_p = (pointer)handleStackTrace;
          sigaction(0xc,(sigaction *)&msg,(sigaction *)0x0);
          pthread_kill((pthread_t)__threadid._M_nxt,0xc);
          sigfillset((sigset_t *)&_mask);
          sigdelset((sigset_t *)&_mask,0xc);
          sigsuspend((sigset_t *)&_mask);
        }
      }
      std::__cxx11::string::assign((char *)&msg_1);
      flushAllLoggers(this,2,&msg_1);
      std::__cxx11::string::~string((string *)&msg_1);
      pthread_mutex_unlock((pthread_mutex_t *)&this->activeThreadsLock);
    }
  }
  else {
    std::__cxx11::string::string
              ((string *)&msg,"will not explore other threads (disabled by user)",
               (allocator *)&_mask);
    flushAllLoggers(this,2,&msg);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 != '\0') {
      poVar2 = std::operator<<((ostream *)&this->crashDumpFile,(string *)&msg);
      std::operator<<(poVar2,"\n\n");
    }
    std::__cxx11::string::~string((string *)&msg);
  }
  return;
}

Assistant:

void SimpleLoggerMgr::logStackBackTraceOtherThreads() {
    bool got_other_stacks = false;
#ifdef __linux__
    if (!crashDumpOriginOnly) {
        // Not support non-Linux platform.
        uint64_t my_tid = pthread_self();
        uint64_t exp = 0;
        if (!crashOriginThread.compare_exchange_strong(exp, my_tid)) {
            // Other thread is already working on it, stop here.
            return;
        }

        std::lock_guard<std::mutex> l(activeThreadsLock);
        std::string msg = "captured ";
        msg += std::to_string(activeThreads.size()) + " active threads";
        flushAllLoggers(2, msg);
        if (crashDumpFile.is_open()) crashDumpFile << msg << "\n\n";

        for (uint64_t _tid: activeThreads) {
            pthread_t tid = (pthread_t)_tid;
            if (_tid == crashOriginThread) continue;

            struct sigaction _action;
            sigfillset(&_action.sa_mask);
            _action.sa_flags = SA_SIGINFO;
            _action.sa_sigaction = SimpleLoggerMgr::handleStackTrace;
            sigaction(SIGUSR2, &_action, NULL);

            pthread_kill(tid, SIGUSR2);

            sigset_t _mask;
            sigfillset(&_mask);
            sigdelset(&_mask, SIGUSR2);
            sigsuspend(&_mask);
        }

        msg = "got all stack traces, now flushing them";
        flushAllLoggers(2, msg);

        got_other_stacks = true;
    }
#endif

    if (!got_other_stacks) {
        std::string msg = "will not explore other threads (disabled by user)";
        flushAllLoggers(2, msg);
        if (crashDumpFile.is_open()) {
            crashDumpFile << msg << "\n\n";
        }
    }
}